

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ElementSelectExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ElementSelectExpressionSyntax,slang::syntax::ExpressionSyntax&,slang::syntax::ElementSelectSyntax&>
          (BumpAllocator *this,ExpressionSyntax *args,ElementSelectSyntax *args_1)

{
  ElementSelectExpressionSyntax *pEVar1;
  size_t in_RDX;
  ElementSelectSyntax *in_RSI;
  BumpAllocator *in_RDI;
  ElementSelectExpressionSyntax *unaff_retaddr;
  
  pEVar1 = (ElementSelectExpressionSyntax *)allocate(in_RDI,(size_t)in_RSI,in_RDX);
  slang::syntax::ElementSelectExpressionSyntax::ElementSelectExpressionSyntax
            (unaff_retaddr,(ExpressionSyntax *)in_RDI,in_RSI);
  return pEVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }